

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_logic.cc
# Opt level: O2

bool __thiscall
CLogicSocket::_HandlePing
          (CLogicSocket *this,lp_connection_t pConn,LPSTRUC_MSG_HEADER pMsgHeader,char *pPkgBody,
          unsigned_short iBodyLength)

{
  time_t tVar1;
  SourceFile file;
  SourceFile file_00;
  MutexLockGuard lock;
  MutexLockGuard local_1030;
  undefined1 local_1028 [12];
  undefined1 local_1018 [12];
  Logger local_1008;
  
  if (muduo::g_logLevel < 3) {
    muduo::Logger::SourceFile::SourceFile<101>
              ((SourceFile *)local_1018,
               (char (*) [101])
               "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/logic/flyd_logic.cc"
              );
    file._12_4_ = 0;
    file.data_ = (char *)local_1018._0_8_;
    file.size_ = local_1018._8_4_;
    muduo::Logger::Logger(&local_1008,file,0xdf);
    muduo::LogStream::operator<<(&local_1008.impl_.stream_,anon_var_dwarf_36d07);
    muduo::Logger::~Logger(&local_1008);
  }
  if (iBodyLength == 0) {
    local_1030.mutex_ = &pConn->logicPorcMutex;
    muduo::MutexLock::lock(local_1030.mutex_);
    tVar1 = time((time_t *)0x0);
    pConn->lastPingTime = tVar1;
    SendNoBodyPkgToClient(this,pMsgHeader,0);
    if (muduo::g_logLevel < 3) {
      muduo::Logger::SourceFile::SourceFile<101>
                ((SourceFile *)local_1028,
                 (char (*) [101])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/logic/flyd_logic.cc"
                );
      file_00._12_4_ = 0;
      file_00.data_ = (char *)local_1028._0_8_;
      file_00.size_ = local_1028._8_4_;
      muduo::Logger::Logger(&local_1008,file_00,0xef);
      muduo::LogStream::operator<<(&local_1008.impl_.stream_,anon_var_dwarf_36d1d);
      muduo::Logger::~Logger(&local_1008);
    }
    muduo::MutexLockGuard::~MutexLockGuard(&local_1030);
  }
  return iBodyLength == 0;
}

Assistant:

bool CLogicSocket::_HandlePing(lp_connection_t pConn,LPSTRUC_MSG_HEADER pMsgHeader,char *pPkgBody,unsigned short iBodyLength)
{
    LOG_INFO << "执行了CLogicSocket::_HandlePing()!" ;
    //（1）首先判断心跳包的合法性
    if(iBodyLength != 0)   //有包体则认为是  非法包
    {
        
        return false;
    }

    muduo::MutexLockGuard lock(pConn->logicPorcMutex);
    pConn->lastPingTime = time(NULL);  //更新心跳包的时间

    //服务器给客户端返回一个只有包头的数据包
    SendNoBodyPkgToClient(pMsgHeader, _CMD_PING);



    LOG_INFO << "成功发送心跳包并返回";

    return true;
}